

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_dump.cpp
# Opt level: O2

void __thiscall hex_dump::dump(hex_dump *this,interface *config,uint8_t *begin,size_t size)

{
  size_t sVar1;
  long lVar2;
  uint8_t uVar3;
  ostream *poVar4;
  long lVar5;
  size_t sVar6;
  uint8_t *puVar7;
  char cVar8;
  byte bVar9;
  size_t sVar10;
  size_t sVar11;
  
  do {
    line_header(this,config);
    do {
      sVar11 = size;
      puVar7 = begin;
      lVar2 = -0xf;
      sVar1 = 0;
      do {
        sVar10 = sVar1;
        lVar5 = lVar2;
        if (sVar11 == sVar10) {
          return;
        }
        bVar9 = puVar7[sVar10];
        cVar8 = (bVar9 >> 4) + 0x57;
        if (bVar9 < 0xa0) {
          cVar8 = (bVar9 >> 4) + 0x30;
        }
        poVar4 = std::operator<<(this->output_,cVar8);
        bVar9 = bVar9 & 0xf;
        cVar8 = bVar9 + 0x57;
        if (bVar9 < 10) {
          cVar8 = bVar9 + 0x30;
        }
        std::operator<<(poVar4,cVar8);
        std::operator<<(this->output_,' ');
        sVar1 = sVar10 + 1;
      } while ((sVar11 - 1 != sVar10) && (lVar2 = lVar5 + 1, sVar10 != 0xf));
      for (; lVar5 != 0; lVar5 = lVar5 + 1) {
        std::operator<<(this->output_,"   ");
      }
      for (sVar6 = 0xffffffffffffffff; sVar10 != sVar6; sVar6 = sVar6 + 1) {
        uVar3 = puVar7[sVar6 + 1];
        if (0x5e < (byte)(uVar3 - 0x20)) {
          uVar3 = '.';
        }
        std::operator<<(this->output_,uVar3);
      }
      std::operator<<(this->output_,'\n');
      begin = puVar7 + sVar1;
      size = sVar11 - sVar1;
    } while (sVar11 - 1 == sVar10);
    begin = puVar7 + sVar1;
    size = sVar11 - sVar1;
  } while( true );
}

Assistant:

void hex_dump::dump( const interface& config, const std::uint8_t* begin, std::size_t size )
{
    static const std::size_t page_width = 16;
    std::size_t              char_cnt   = page_width;
    const std::uint8_t*      line_start = begin;

    line_header( config );

    while ( size )
    {
        print_hex( output_, *begin );
        output_ << ' ';

        --size;
        ++begin;
        --char_cnt;

        if ( char_cnt == 0 || size == 0 )
        {
            // fill rest of the line
            for ( ; char_cnt != 0; --char_cnt)
                output_ << "   ";

            for ( ; line_start != begin; ++line_start )
                output_ << as_printable( *line_start );

            output_ << '\n';

            if ( size )
                line_header( config );

            char_cnt   = page_width;
        }
    }
}